

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O3

void asm_callid(ASMState *as,IRIns *ir,IRCallID id)

{
  undefined1 in_XMM0 [16];
  undefined1 auVar1 [16];
  undefined8 local_20;
  
  auVar1 = pmovzxwd(in_XMM0,*ir);
  local_20 = auVar1._0_8_;
  asm_setupresult(as,ir,lj_ir_callinfo + id);
  asm_gencall(as,lj_ir_callinfo + id,(IRRef *)&local_20);
  return;
}

Assistant:

static void asm_callid(ASMState *as, IRIns *ir, IRCallID id)
{
  const CCallInfo *ci = &lj_ir_callinfo[id];
  IRRef args[2];
  args[0] = ir->op1;
  args[1] = ir->op2;
  asm_setupresult(as, ir, ci);
  asm_gencall(as, ci, args);
}